

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O1

bool __thiscall tcu::App::iterate(App *this)

{
  TestSessionExecutor *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  RunMode RVar5;
  char *format;
  double dVar6;
  
  if (this->m_testExecutor == (TestSessionExecutor *)0x0) {
    bVar3 = false;
  }
  else {
    iVar4 = (*this->m_platform->_vptr_Platform[2])();
    bVar2 = (byte)iVar4;
    if (bVar2 == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = TestSessionExecutor::iterate(this->m_testExecutor);
    }
    if ((bVar2 & bVar3) == 0) {
      format = "\nABORTED!\n";
      if (bVar2 != 0) {
        format = "\nDONE!\n";
      }
      tcu::print(format);
      RVar5 = CommandLine::getRunMode(this->m_testCtx->m_cmdLine);
      if (RVar5 == RUNMODE_EXECUTE) {
        pTVar1 = this->m_testExecutor;
        tcu::print("\nTest run totals:\n");
        iVar4 = (pTVar1->m_status).numExecuted;
        dVar6 = 0.0;
        if (0 < iVar4) {
          dVar6 = (double)(((float)(pTVar1->m_status).numPassed * 100.0) / (float)iVar4);
        }
        tcu::print("  Passed:        %d/%d (%.1f%%)\n",dVar6);
        iVar4 = (pTVar1->m_status).numExecuted;
        dVar6 = 0.0;
        if (0 < iVar4) {
          dVar6 = (double)(((float)(pTVar1->m_status).numFailed * 100.0) / (float)iVar4);
        }
        tcu::print("  Failed:        %d/%d (%.1f%%)\n",dVar6);
        iVar4 = (pTVar1->m_status).numExecuted;
        dVar6 = 0.0;
        if (0 < iVar4) {
          dVar6 = (double)(((float)(pTVar1->m_status).numNotSupported * 100.0) / (float)iVar4);
        }
        tcu::print("  Not supported: %d/%d (%.1f%%)\n",dVar6);
        iVar4 = (pTVar1->m_status).numExecuted;
        dVar6 = 0.0;
        if (0 < iVar4) {
          dVar6 = (double)(((float)(pTVar1->m_status).numWarnings * 100.0) / (float)iVar4);
        }
        tcu::print("  Warnings:      %d/%d (%.1f%%)\n",dVar6);
        if ((pTVar1->m_status).isComplete == false) {
          tcu::print("Test run was ABORTED!\n");
        }
      }
    }
    bVar3 = (bool)(bVar2 & bVar3);
  }
  return bVar3;
}

Assistant:

bool App::iterate (void)
{
	if (!m_testExecutor)
	{
		DE_ASSERT(m_testCtx->getCommandLine().getRunMode() != RUNMODE_EXECUTE);
		return false;
	}

	// Poll platform events
	const bool platformOk = m_platform.processEvents();

	// Iterate a step.
	bool testExecOk = false;
	if (platformOk)
	{
		try
		{
			testExecOk = m_testExecutor->iterate();
		}
		catch (const std::exception& e)
		{
			die("%s", e.what());
		}
	}

	if (!platformOk || !testExecOk)
	{
		if (!platformOk)
			print("\nABORTED!\n");
		else
			print("\nDONE!\n");

		const RunMode runMode = m_testCtx->getCommandLine().getRunMode();
		if (runMode == RUNMODE_EXECUTE)
		{
			const TestRunStatus& result = m_testExecutor->getStatus();

			// Report statistics.
			print("\nTest run totals:\n");
			print("  Passed:        %d/%d (%.1f%%)\n", result.numPassed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numPassed			/ (float)result.numExecuted) : 0.0f));
			print("  Failed:        %d/%d (%.1f%%)\n", result.numFailed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numFailed			/ (float)result.numExecuted) : 0.0f));
			print("  Not supported: %d/%d (%.1f%%)\n", result.numNotSupported,	result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numNotSupported	/ (float)result.numExecuted) : 0.0f));
			print("  Warnings:      %d/%d (%.1f%%)\n", result.numWarnings,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numWarnings		/ (float)result.numExecuted) : 0.0f));
			if (!result.isComplete)
				print("Test run was ABORTED!\n");
		}
	}

	return platformOk && testExecOk;
}